

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstackedlayout.cpp
# Opt level: O1

void __thiscall QStackedLayout::setGeometry(QStackedLayout *this)

{
  QRect *in_RSI;
  
  setGeometry((QStackedLayout *)&this[-1].super_QLayout.super_QLayoutItem,in_RSI);
  return;
}

Assistant:

void QStackedLayout::setGeometry(const QRect &rect)
{
    Q_D(QStackedLayout);
    switch (d->stackingMode) {
    case StackOne:
        if (QWidget *widget = currentWidget())
            widget->setGeometry(rect);
        break;
    case StackAll:
        if (const int n = d->list.size())
            for (int i = 0; i < n; ++i)
                if (QWidget *widget = d->list.at(i)->widget())
                    widget->setGeometry(rect);
        break;
    }
}